

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clEnqueueNDRangeKernel
                 (cl_command_queue command_queue,cl_kernel kernel,cl_uint work_dim,
                 size_t *global_work_offset,size_t *global_work_size,size_t *param_6,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CTracker *pCVar1;
  size_t sVar2;
  CLIntercept *this;
  bool forCaptureReplay;
  int iVar3;
  cl_int cVar4;
  cl_int errorCode;
  uint64_t enqueueCounter;
  mapped_type *pmVar5;
  time_point tVar6;
  time_point tVar7;
  bool bVar8;
  string argsString;
  string hostTag;
  cl_event local_event;
  string deviceTag;
  time_point local_d0;
  string local_c0;
  size_t *local_a0;
  size_t *local_98;
  time_point local_90;
  string local_88;
  time_point local_68;
  undefined8 local_60;
  cl_event local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  if ((g_pIntercept->m_Dispatch).clEnqueueNDRangeKernel == (cl_api_clEnqueueNDRangeKernel)0x0) {
    return -0x24;
  }
  local_a0 = param_6;
  local_98 = global_work_offset;
  enqueueCounter = CLIntercept::incrementEnqueueCounter(g_pIntercept);
  if ((this->m_Config).CaptureReplay == true) {
    forCaptureReplay = false;
    if (((this->m_Config).CaptureReplayMinEnqueue <= enqueueCounter) &&
       (enqueueCounter <= (this->m_Config).CaptureReplayMaxEnqueue)) {
      local_c0._M_dataplus._M_p = (pointer)kernel;
      if ((this->m_Config).CaptureReplayKernelName._M_string_length != 0) {
        pmVar5 = std::
                 map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
                 ::operator[](&this->m_KernelInfoMap,(key_type *)&local_c0);
        sVar2 = (pmVar5->KernelName)._M_string_length;
        if ((sVar2 != (this->m_Config).CaptureReplayKernelName._M_string_length) ||
           ((sVar2 != 0 &&
            (iVar3 = bcmp((pmVar5->KernelName)._M_dataplus._M_p,
                          (this->m_Config).CaptureReplayKernelName._M_dataplus._M_p,sVar2),
            iVar3 != 0)))) goto LAB_0012277a;
      }
      forCaptureReplay = CLIntercept::checkCaptureReplayKernelSkips(this,kernel);
    }
  }
  else {
LAB_0012277a:
    forCaptureReplay = false;
  }
  if (forCaptureReplay != false) {
    CLIntercept::startCaptureReplay
              (this,enqueueCounter,kernel,work_dim,local_98,global_work_size,local_a0);
  }
  if ((this->m_Config).DumpBuffersBeforeEnqueue == true) {
    bVar8 = false;
    if ((((this->m_Config).DumpBuffersMinEnqueue <= enqueueCounter) &&
        (enqueueCounter <= (this->m_Config).DumpBuffersMaxEnqueue)) &&
       (bVar8 = true, local_c0._M_dataplus._M_p = (pointer)kernel,
       (this->m_Config).DumpBuffersForKernel._M_string_length != 0)) {
      pmVar5 = std::
               map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
               ::operator[](&this->m_KernelInfoMap,(key_type *)&local_c0);
      sVar2 = (pmVar5->KernelName)._M_string_length;
      if (sVar2 != (this->m_Config).DumpBuffersForKernel._M_string_length) goto LAB_00122815;
      if (sVar2 != 0) {
        iVar3 = bcmp((pmVar5->KernelName)._M_dataplus._M_p,
                     (this->m_Config).DumpBuffersForKernel._M_dataplus._M_p,sVar2);
        bVar8 = iVar3 == 0;
      }
    }
  }
  else {
LAB_00122815:
    bVar8 = false;
  }
  if ((forCaptureReplay | bVar8) == 1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Pre","");
    CLIntercept::dumpBuffersForKernel
              (this,&local_c0,forCaptureReplay,bVar8,enqueueCounter,kernel,command_queue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).DumpImagesBeforeEnqueue == true) {
    bVar8 = false;
    if ((((this->m_Config).DumpImagesMinEnqueue <= enqueueCounter) &&
        (enqueueCounter <= (this->m_Config).DumpImagesMaxEnqueue)) &&
       (bVar8 = true, local_c0._M_dataplus._M_p = (pointer)kernel,
       (this->m_Config).DumpImagesForKernel._M_string_length != 0)) {
      pmVar5 = std::
               map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
               ::operator[](&this->m_KernelInfoMap,(key_type *)&local_c0);
      sVar2 = (pmVar5->KernelName)._M_string_length;
      if (sVar2 != (this->m_Config).DumpImagesForKernel._M_string_length) goto LAB_001228e7;
      if (sVar2 != 0) {
        iVar3 = bcmp((pmVar5->KernelName)._M_dataplus._M_p,
                     (this->m_Config).DumpImagesForKernel._M_dataplus._M_p,sVar2);
        bVar8 = iVar3 == 0;
      }
    }
  }
  else {
LAB_001228e7:
    bVar8 = false;
  }
  if ((forCaptureReplay | bVar8) == 1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Pre","");
    CLIntercept::dumpImagesForKernel
              (this,&local_c0,forCaptureReplay,bVar8,enqueueCounter,kernel,command_queue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).InjectBuffers == true) {
    CLIntercept::injectBuffersForKernel(this,enqueueCounter,kernel,command_queue);
  }
  if ((this->m_Config).InjectImages == true) {
    CLIntercept::injectImagesForKernel(this,enqueueCounter,kernel,command_queue);
  }
  if ((((this->m_Config).AubCapture == true) &&
      ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
     ((enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue &&
      (bVar8 = CLIntercept::checkAubCaptureKernelSignature
                         (this,kernel,work_dim,global_work_size,local_a0), bVar8)))) {
    CLIntercept::startAubCapture
              (this,"clEnqueueNDRangeKernel",enqueueCounter,kernel,work_dim,global_work_size,
               local_a0,command_queue);
  }
  cVar4 = 0;
  if ((this->m_Config).NullEnqueue == false) {
    if ((this->m_Config).NullLocalWorkSize == true) {
      local_a0 = (size_t *)0x0;
    }
    CLIntercept::overrideNullLocalWorkSize(this,work_dim,global_work_size,&local_a0);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::getEnqueueNDRangeKernelArgsString
                (this,work_dim,local_98,global_work_size,local_a0,&local_c0);
      getFormattedEventWaitList_abi_cxx11_(&local_88,this,num_events_in_wait_list,event_wait_list);
      std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_88._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingEnter
                (this,"clEnqueueNDRangeKernel",enqueueCounter,kernel,"queue = %p, kernel = %p, %s",
                 command_queue,kernel,local_c0._M_dataplus._M_p);
    }
    if ((this->m_Config).EventChecking == true) {
      CLIntercept::checkEventList
                (this,"clEnqueueNDRangeKernel",num_events_in_wait_list,event_wait_list,event);
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if ((((this->m_Config).ChromeCallLogging != false) ||
        ((((this->m_Config).HostPerformanceTiming == true &&
          ((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter)) &&
         (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) ||
       (((((this->m_Config).DevicePerformanceTiming != false ||
          ((this->m_Config).ITTPerformanceTiming != false)) ||
         (((this->m_Config).ChromePerformanceTiming != false ||
          ((this->m_Config).DevicePerfCounterEventBasedSampling == true)))) &&
        (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)))))) {
      CLIntercept::getTimingTagsKernel
                (this,command_queue,kernel,work_dim,local_98,global_work_size,local_a0,&local_88,
                 &local_50);
    }
    local_58 = (cl_event)0x0;
    if (((((this->m_Config).DevicePerformanceTiming == false) &&
         ((this->m_Config).ITTPerformanceTiming == false)) &&
        ((this->m_Config).ChromePerformanceTiming == false)) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != true)) {
      local_68.__d.__r = (duration)0;
      local_60 = 0;
    }
    else {
      local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_60 = CONCAT71((int7)((ulong)local_68.__d.__r >> 8),event == (cl_event *)0x0);
      if (event == (cl_event *)0x0) {
        event = &local_58;
      }
    }
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_90.__d.__r = (duration)0;
    }
    else {
      local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    if ((this->m_Config).Emulate_cl_intel_unified_shared_memory == true) {
      CLIntercept::setUSMKernelExecInfo(this,command_queue,kernel);
    }
    if (((this->m_Config).OverrideBuiltinKernels == true) &&
       (cVar4 = CLIntercept::NDRangeBuiltinKernel
                          (this,command_queue,kernel,work_dim,local_98,global_work_size,local_a0,
                           num_events_in_wait_list,event_wait_list,event), cVar4 == 0)) {
      cVar4 = 0;
    }
    else {
      cVar4 = (*(this->m_Dispatch).clEnqueueNDRangeKernel)
                        (command_queue,kernel,work_dim,local_98,global_work_size,local_a0,
                         num_events_in_wait_list,event_wait_list,event);
    }
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_d0.__d.__r = (duration)0;
    }
    else {
      local_d0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        CLIntercept::updateHostTimingStats
                  (this,"clEnqueueNDRangeKernel",&local_88,local_90,local_d0);
      }
    }
    if ((((this->m_Config).DevicePerformanceTiming == false) &&
        ((this->m_Config).ITTPerformanceTiming == false)) &&
       ((this->m_Config).ChromePerformanceTiming == false)) {
      if ((event != (cl_event *)0x0) &&
         ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00122da6:
        if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
           (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
          CLIntercept::addTimingEvent
                    (this,"clEnqueueNDRangeKernel",enqueueCounter,local_68,&local_50,command_queue,
                     *event);
        }
        if ((char)local_60 != '\0') {
          (*(this->m_Dispatch).clReleaseEvent)(*event);
          goto LAB_00122dfe;
        }
      }
    }
    else {
      if (event != (cl_event *)0x0) goto LAB_00122da6;
LAB_00122dfe:
      event = (cl_event *)0x0;
    }
    bVar8 = (this->m_Config).ErrorLogging;
    if ((bVar8 == false) && ((this->m_Config).ErrorAssert == false)) {
      if ((cVar4 != 0) && ((this->m_Config).NoErrors != false)) {
LAB_00122e2e:
        if (bVar8 != false) {
          CLIntercept::logError(this,"clEnqueueNDRangeKernel",cVar4);
        }
        if ((this->m_Config).ErrorAssert == true) {
          raise(5);
        }
        if ((this->m_Config).NoErrors != false) {
          cVar4 = 0;
        }
      }
    }
    else {
      if (cVar4 != 0) goto LAB_00122e2e;
      cVar4 = 0;
    }
    if (((event != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
       (*event != (cl_event)0x0)) {
      LOCK();
      pCVar1 = &(this->m_ObjectTracker).m_Events;
      (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
           (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clEnqueueNDRangeKernel",cVar4,event,(cl_sync_point_khr *)0x0);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      CLIntercept::chromeCallLoggingExit
                (this,"clEnqueueNDRangeKernel",&local_88,true,enqueueCounter,local_90,local_d0);
    }
    if (((event != (cl_event *)0x0) && (*event != (cl_event)0x0)) &&
       (((this->m_Config).ChromeCallLogging != false ||
        ((this->m_Config).ChromePerformanceTiming == true)))) {
      CLIntercept::addEvent(this,*event,enqueueCounter);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).DumpBuffersAfterEnqueue == true) {
    bVar8 = false;
    if ((((this->m_Config).DumpBuffersMinEnqueue <= enqueueCounter) &&
        (enqueueCounter <= (this->m_Config).DumpBuffersMaxEnqueue)) &&
       (bVar8 = true, local_c0._M_dataplus._M_p = (pointer)kernel,
       (this->m_Config).DumpBuffersForKernel._M_string_length != 0)) {
      pmVar5 = std::
               map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
               ::operator[](&this->m_KernelInfoMap,(key_type *)&local_c0);
      sVar2 = (pmVar5->KernelName)._M_string_length;
      if (sVar2 != (this->m_Config).DumpBuffersForKernel._M_string_length) goto LAB_00122fb8;
      if (sVar2 != 0) {
        iVar3 = bcmp((pmVar5->KernelName)._M_dataplus._M_p,
                     (this->m_Config).DumpBuffersForKernel._M_dataplus._M_p,sVar2);
        bVar8 = iVar3 == 0;
      }
    }
  }
  else {
LAB_00122fb8:
    bVar8 = false;
  }
  if ((forCaptureReplay | bVar8) == 1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Post","");
    CLIntercept::dumpBuffersForKernel
              (this,&local_c0,forCaptureReplay,bVar8,enqueueCounter,kernel,command_queue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).DumpImagesAfterEnqueue == true) {
    bVar8 = false;
    if (((enqueueCounter < (this->m_Config).DumpImagesMinEnqueue) ||
        ((this->m_Config).DumpImagesMaxEnqueue < enqueueCounter)) ||
       (bVar8 = true, local_c0._M_dataplus._M_p = (pointer)kernel,
       (this->m_Config).DumpImagesForKernel._M_string_length == 0)) goto LAB_00123095;
    pmVar5 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,(key_type *)&local_c0);
    sVar2 = (pmVar5->KernelName)._M_string_length;
    if (sVar2 == (this->m_Config).DumpImagesForKernel._M_string_length) {
      if (sVar2 != 0) {
        iVar3 = bcmp((pmVar5->KernelName)._M_dataplus._M_p,
                     (this->m_Config).DumpImagesForKernel._M_dataplus._M_p,sVar2);
        bVar8 = iVar3 == 0;
      }
      goto LAB_00123095;
    }
  }
  bVar8 = false;
LAB_00123095:
  if ((forCaptureReplay | bVar8) == 1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Post","");
    CLIntercept::dumpImagesForKernel
              (this,&local_c0,forCaptureReplay,bVar8,enqueueCounter,kernel,command_queue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueNDRangeKernel");
    errorCode = (*(this->m_Dispatch).clFinish)(command_queue);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd(this,"clFinish","clEnqueueNDRangeKernel",errorCode)
    ;
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&local_c0,tVar6,tVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&local_c0,false,0,tVar6,tVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&local_c0,tVar6,tVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&local_c0,false,0,tVar6,tVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(command_queue);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,command_queue);
  }
  return cVar4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueNDRangeKernel)(
    cl_command_queue command_queue,
    cl_kernel kernel,
    cl_uint work_dim,
    const size_t* global_work_offset,
    const size_t* global_work_size,
    const size_t* local_work_size,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueNDRangeKernel )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_CAPTURE_REPLAY_START_KERNEL(
            kernel,
            work_dim,
            global_work_offset,
            global_work_size,
            local_work_size );
        DUMP_BUFFERS_BEFORE_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_BEFORE_ENQUEUE( kernel, command_queue );
        INJECT_MEMORY_OBJECTS( kernel, command_queue );
        CHECK_AUBCAPTURE_START_KERNEL(
            kernel,
            work_dim,
            global_work_size,
            local_work_size,
            command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            if( pIntercept->config().NullLocalWorkSize )
            {
                local_work_size = NULL;
            }
            pIntercept->overrideNullLocalWorkSize(
                work_dim,
                global_work_size,
                local_work_size );

            std::string argsString;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getEnqueueNDRangeKernelArgsString(
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    argsString );
                argsString += getFormattedEventWaitList(
                    pIntercept,
                    num_events_in_wait_list,
                    event_wait_list);
            }
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "queue = %p, kernel = %p, %s",
                command_queue,
                kernel,
                argsString.c_str() );

            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            GET_TIMING_TAGS_KERNEL(
                command_queue,
                kernel,
                work_dim,
                global_work_offset,
                global_work_size,
                local_work_size );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

//            ITT_ADD_PARAM_AS_METADATA(command_queue);
//            ITT_ADD_PARAM_AS_METADATA(kernel);
            ITT_ADD_PARAM_AS_METADATA(work_dim);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_offset);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, global_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(work_dim, local_work_size);
            ITT_ADD_ARRAY_PARAM_AS_METADATA(num_events_in_wait_list, event_wait_list);

            if( pIntercept->config().Emulate_cl_intel_unified_shared_memory )
            {
                pIntercept->setUSMKernelExecInfo(
                    command_queue,
                    kernel );
            }

            retVal = CL_INVALID_OPERATION;

            if( ( retVal != CL_SUCCESS ) &&
                pIntercept->config().OverrideBuiltinKernels )
            {

                retVal = pIntercept->NDRangeBuiltinKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            if( retVal != CL_SUCCESS )
            {
                retVal = pIntercept->dispatch().clEnqueueNDRangeKernel(
                    command_queue,
                    kernel,
                    work_dim,
                    global_work_offset,
                    global_work_size,
                    local_work_size,
                    num_events_in_wait_list,
                    event_wait_list,
                    event );
            }

            HOST_PERFORMANCE_TIMING_END_WITH_TAG();
            DEVICE_PERFORMANCE_TIMING_END_WITH_TAG( command_queue, event );
            CHECK_ERROR( retVal );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT_WITH_TAG( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        DUMP_BUFFERS_AFTER_ENQUEUE( kernel, command_queue );
        DUMP_IMAGES_AFTER_ENQUEUE( kernel, command_queue );
        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}